

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

RegisterKind arm::register_type(Reg r)

{
  RegisterKind RVar1;
  
  RVar1 = GeneralPurpose;
  if ((((0xf < r) && (RVar1 = DoubleVector, 0x2f < r)) && (RVar1 = QuadVector, 0x3f < r)) &&
     (RVar1 = VirtualGeneralPurpose, (int)r < 0)) {
    return VirtualQuadVector - (r < 0xc0000000);
  }
  return RVar1;
}

Assistant:

RegisterKind register_type(Reg r) {
  if (r < 16)
    return RegisterKind::GeneralPurpose;
  else if (r < 48)
    return RegisterKind::DoubleVector;
  else if (r < 64)
    return RegisterKind::QuadVector;
  else if (r < 1 << 31)
    return RegisterKind::VirtualGeneralPurpose;
  else if (r < 3 << 30)
    return RegisterKind::VirtualDoubleVector;
  else
    return RegisterKind::VirtualQuadVector;
}